

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O3

void Cec2_ManSimClassRefineOne(Gia_Man_t *p,int iRepr)

{
  word *pwVar1;
  word *pwVar2;
  Gia_Rpr_t *pGVar3;
  uint uVar4;
  uint uVar5;
  word *pwVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int *piVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  
  if ((~(uint)p->pReprs[iRepr] & 0xfffffff) == 0) {
    uVar9 = p->pNexts[iRepr];
    if (0 < (int)uVar9) {
      uVar12 = p->nSimWords;
      uVar7 = uVar12 * iRepr;
      if (-1 < (int)uVar7) {
        uVar4 = p->vSims->nSize;
        if ((int)uVar7 < (int)uVar4) {
          pwVar6 = p->vSims->pArray;
          pwVar1 = pwVar6 + uVar7;
          uVar7 = iRepr;
          while ((uVar8 = uVar9, uVar9 = uVar12 * uVar8, -1 < (int)uVar9 && (uVar9 < uVar4))) {
            pwVar2 = pwVar6 + uVar9;
            if ((((uint)*pwVar2 ^ (uint)*pwVar1) & 1) == 0) {
              if (0 < (int)uVar12) {
                uVar13 = 0;
                do {
                  if (pwVar1[uVar13] != pwVar2[uVar13]) goto LAB_00650a1a;
                  uVar13 = uVar13 + 1;
                } while (uVar12 != uVar13);
              }
            }
            else if (0 < (int)uVar12) {
              uVar13 = 0;
              do {
                if ((pwVar2[uVar13] ^ pwVar1[uVar13]) != 0xffffffffffffffff) goto LAB_00650a1a;
                uVar13 = uVar13 + 1;
              } while (uVar12 != uVar13);
            }
            uVar9 = p->pNexts[uVar8];
            uVar7 = uVar8;
            if ((int)uVar9 < 1) {
              return;
            }
          }
        }
      }
LAB_00650b54:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
  }
  __assert_fail("Gia_ObjIsHead(p, iRepr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                ,0x251,"void Cec2_ManSimClassRefineOne(Gia_Man_t *, int)");
LAB_00650a1a:
  pGVar3 = p->pReprs + uVar8;
  *pGVar3 = (Gia_Rpr_t)((uint)*pGVar3 | 0xfffffff);
  piVar11 = p->pNexts;
  uVar9 = piVar11[uVar8];
  uVar12 = uVar8;
  if ((int)uVar9 < 1) {
LAB_00650b32:
    piVar11[(int)uVar7] = -1;
    piVar11[(int)uVar12] = -1;
    return;
  }
LAB_00650a47:
  uVar4 = p->nSimWords;
  uVar10 = uVar4 * iRepr;
  if (-1 < (int)uVar10) {
    uVar5 = p->vSims->nSize;
    if ((((int)uVar10 < (int)uVar5) && (uVar14 = uVar4 * uVar9, -1 < (int)uVar14)) &&
       (uVar14 < uVar5)) {
      pwVar6 = p->vSims->pArray;
      pwVar1 = pwVar6 + uVar10;
      pwVar6 = pwVar6 + uVar14;
      if ((((uint)*pwVar6 ^ (uint)*pwVar1) & 1) == 0) {
        if (0 < (int)uVar4) {
          uVar13 = 0;
          do {
            if (pwVar1[uVar13] != pwVar6[uVar13]) goto LAB_00650aec;
            uVar13 = uVar13 + 1;
          } while (uVar4 != uVar13);
        }
      }
      else if (0 < (int)uVar4) {
        uVar13 = 0;
        do {
          if ((pwVar6[uVar13] ^ pwVar1[uVar13]) != 0xffffffffffffffff) goto LAB_00650aec;
          uVar13 = uVar13 + 1;
        } while (uVar4 != uVar13);
      }
      piVar11[(int)uVar7] = uVar9;
      uVar7 = uVar9;
      goto LAB_00650b20;
    }
  }
  goto LAB_00650b54;
LAB_00650aec:
  if ((uVar8 != 0xfffffff) && ((int)uVar9 <= (int)uVar8)) {
    __assert_fail("Num == GIA_VOID || Num < Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
  }
  p->pReprs[uVar9] = (Gia_Rpr_t)((uint)p->pReprs[uVar9] & 0xf0000000 | uVar8 & 0xfffffff);
  piVar11 = p->pNexts;
  piVar11[(int)uVar12] = uVar9;
  uVar12 = uVar9;
LAB_00650b20:
  uVar9 = piVar11[uVar9];
  if ((int)uVar9 < 1) goto LAB_00650b32;
  goto LAB_00650a47;
}

Assistant:

void Cec2_ManSimClassRefineOne( Gia_Man_t * p, int iRepr )
{
    int iObj, iPrev = iRepr, iPrev2, iRepr2;
    Gia_ClassForEachObj1( p, iRepr, iRepr2 )
        if ( Cec2_ObjSimEqual(p, iRepr, iRepr2) )
            iPrev = iRepr2;
        else
            break;
    if ( iRepr2 <= 0 ) // no refinement
        return;
    // relink remaining nodes of the class
    // nodes that are equal to iRepr, remain in the class of iRepr
    // nodes that are not equal to iRepr, move to the class of iRepr2
    Gia_ObjSetRepr( p, iRepr2, GIA_VOID );
    iPrev2 = iRepr2;
    for ( iObj = Gia_ObjNext(p, iRepr2); iObj > 0; iObj = Gia_ObjNext(p, iObj) )
    {
        if ( Cec2_ObjSimEqual(p, iRepr, iObj) ) // remains with iRepr
        {
            Gia_ObjSetNext( p, iPrev, iObj );
            iPrev = iObj;
        }
        else // moves to iRepr2
        {
            Gia_ObjSetRepr( p, iObj, iRepr2 );
            Gia_ObjSetNext( p, iPrev2, iObj );
            iPrev2 = iObj;
        }
    }
    Gia_ObjSetNext( p, iPrev, -1 );
    Gia_ObjSetNext( p, iPrev2, -1 );
}